

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O1

void __thiscall gdsForge::gdsText(gdsForge *this,gdsTEXT *in_TEXT,bool minimal)

{
  _Base_bitset<1UL> _Var1;
  pointer pcVar2;
  undefined7 in_register_00000011;
  _Base_bitset<1UL> inBits;
  int data [1];
  int corXY [2];
  uint local_78;
  int local_74;
  int local_70;
  undefined4 local_6c;
  string local_68;
  string local_48;
  
  local_74 = 0xc0400;
  fwrite(&local_74,1,4,(FILE *)this->gdsFile);
  if ((int)CONCAT71(in_register_00000011,minimal) == 0) {
    local_78 = in_TEXT->plex;
    GDSwriteInt(this,0x2f03,(int *)&local_78,1);
  }
  local_78 = in_TEXT->layer;
  GDSwriteInt(this,0xd02,(int *)&local_78,1);
  local_78 = in_TEXT->text_type;
  GDSwriteInt(this,0x1602,(int *)&local_78,1);
  GDSwriteBitArr(this,0x1701,(bitset<16UL>)0x0);
  local_78 = in_TEXT->width;
  GDSwriteInt(this,0xf03,(int *)&local_78,1);
  inBits._M_w = (_WordT)((-(uint)(in_TEXT->scale != 1.0) & 1) << 2);
  _Var1._M_w = inBits._M_w + 2;
  if (in_TEXT->angle != 0.0) {
    inBits._M_w = _Var1._M_w;
  }
  if (NAN(in_TEXT->angle)) {
    inBits._M_w = _Var1._M_w;
  }
  GDSwriteBitArr(this,0x1a01,(bitset<16UL>)inBits._M_w);
  local_74 = in_TEXT->xCor;
  local_70 = in_TEXT->yCor;
  GDSwriteInt(this,0x1003,&local_74,2);
  pcVar2 = (in_TEXT->textbody)._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + (in_TEXT->textbody)._M_string_length);
  GDSwriteStr(this,0x1906,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (!minimal) {
    local_78 = in_TEXT->propattr;
    GDSwriteInt(this,0x2b02,(int *)&local_78,1);
    pcVar2 = (in_TEXT->propvalue)._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,pcVar2 + (in_TEXT->propvalue)._M_string_length);
    GDSwriteStr(this,0x2c06,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  local_6c = 0x110400;
  fwrite(&local_6c,1,4,(FILE *)this->gdsFile);
  return;
}

Assistant:

void gdsForge::gdsText(const gdsTEXT &in_TEXT, bool minimal)
{
  int data[1];
  this->GDSwriteRec(GDS_TEXT);

  // ELFLAGS and PLEX are optional
  if (minimal == false) {
    data[0] = in_TEXT.plex;
    this->GDSwriteInt(GDS_PLEX, data, 1);
  }

  // Layer number, 0 to 63
  data[0] = in_TEXT.layer;
  this->GDSwriteInt(GDS_LAYER, data, 1);

  data[0] = in_TEXT.text_type;
  this->GDSwriteInt(GDS_TEXTTYPE, data, 1);

  // PRESENTATION; PATHTYPE, WIDTH, STRANS, MAG, and ANGLE are optional
  bitset<16> bits;

  // this->GDSwriteBitArr(GDS_PRESENTATION, presentation_flags);
  this->GDSwriteBitArr(GDS_PRESENTATION, bits);

  data[0] = in_TEXT.width;
  this->GDSwriteInt(GDS_WIDTH, data, 1);

  // magnification, default 1
  if (in_TEXT.scale == 1)
    bits.set(2, 0);
  else
    bits.set(2, 1);

  // angle of rotation
  if (in_TEXT.angle == 0)
    bits.set(1, 0);
  else
    bits.set(1, 1);

  this->GDSwriteBitArr(GDS_STRANS, bits);

  int corXY[2];
  corXY[0] = in_TEXT.xCor;
  corXY[1] = in_TEXT.yCor;
  this->GDSwriteInt(GDS_XY, corXY, 2);

  // text/string to be used of the structure that is referenced
  this->GDSwriteStr(GDS_STRING, in_TEXT.textbody);

  // Optional goodies
  if (minimal == false) { // false
    data[0] = in_TEXT.propattr;
    this->GDSwriteInt(GDS_PROPATTR, data, 1);
    this->GDSwriteStr(GDS_PROPVALUE, in_TEXT.propvalue);
  }

  this->GDSwriteRec(GDS_ENDEL);
}